

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<unsigned_int>::reserve(ImVector<unsigned_int> *this,int new_capacity)

{
  int *piVar1;
  ImGuiContext *pIVar2;
  uint *__dest;
  uint *ptr;
  
  pIVar2 = GImGui;
  if (this->Capacity < new_capacity) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (uint *)(*(pIVar2->IO).MemAllocFn)((long)new_capacity << 2);
    if (this->Data == (uint *)0x0) {
      ptr = (uint *)0x0;
    }
    else {
      memcpy(__dest,this->Data,(long)this->Size << 2);
      ptr = this->Data;
    }
    ImGui::MemFree(ptr);
    this->Data = __dest;
    this->Capacity = new_capacity;
  }
  return;
}

Assistant:

inline void                 reserve(int new_capacity)
    {
        if (new_capacity <= Capacity) return;
        T* new_data = (value_type*)ImGui::MemAlloc((size_t)new_capacity * sizeof(value_type));
        if (Data)
            memcpy(new_data, Data, (size_t)Size * sizeof(value_type));
        ImGui::MemFree(Data);
        Data = new_data;
        Capacity = new_capacity;
    }